

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O3

Gia_Man_t * Gia_ManUnrollAndCofactor(Gia_Man_t *p,int nFrames,int nFanMax,int fVerbose)

{
  int *__ptr;
  Gia_Man_t *pGVar1;
  Gia_Man_t *p_00;
  Vec_Int_t *vSigs;
  Vec_Int_t *vSigs_00;
  int iVar2;
  undefined4 in_register_0000000c;
  
  iVar2 = fVerbose;
  pGVar1 = Gia_ManUnrollInit(p,nFrames);
  p_00 = Gia_ManCleanup(pGVar1);
  vSigs = Gia_ManDetectSeqSignalsWithFanout(p,nFanMax,fVerbose);
  vSigs_00 = Gia_ManTransferFrames
                       (p,pGVar1,nFrames,(Gia_Man_t *)CONCAT44(in_register_0000000c,iVar2),vSigs);
  if (vSigs->pArray != (int *)0x0) {
    free(vSigs->pArray);
  }
  free(vSigs);
  Gia_ManStop(pGVar1);
  __ptr = (p->vCopies).pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (p->vCopies).pArray = (int *)0x0;
  }
  (p->vCopies).nCap = 0;
  (p->vCopies).nSize = 0;
  pGVar1 = Gia_ManDupCofAllInt(p_00,vSigs_00,fVerbose);
  if (vSigs_00->pArray != (int *)0x0) {
    free(vSigs_00->pArray);
  }
  free(vSigs_00);
  Gia_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManUnrollAndCofactor( Gia_Man_t * p, int nFrames, int nFanMax, int fVerbose )
{
    Vec_Int_t * vCofSigs, * vTemp;
    Gia_Man_t * pAig, * pFrames, * pNew;
    // compute initialized timeframes
    pFrames  = Gia_ManUnrollInit( p, nFrames );
    pAig     = Gia_ManCleanup( pFrames );
    // compute and remap set/reset/enable signals
    vCofSigs = Gia_ManDetectSeqSignalsWithFanout( p, nFanMax, fVerbose );
    vCofSigs = Gia_ManTransferFrames( p, pFrames, nFrames, pAig, vTemp = vCofSigs );
    Vec_IntFree( vTemp );
    Gia_ManStop( pFrames );
    Vec_IntErase( &p->vCopies );
    // cofactor all these variables
    pNew = Gia_ManDupCofAllInt( pAig, vCofSigs, fVerbose );
    Vec_IntFree( vCofSigs );
    Gia_ManStop( pAig );
    return pNew;
}